

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::clear(array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
        *this)

{
  long *in_RDI;
  data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x18))();
  in_RDI[6] = 0;
  in_RDI[2] = 0;
  if (in_RDI[4] != 0) {
    memory_manager_stateless_kernel_1<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::deallocate_array((memory_manager_stateless_kernel_1<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this,in_stack_00000008);
  }
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

void array<T,mem_manager>::
    clear (
    )
    {
        reset();
        last_pos = 0;
        array_size = 0;
        if (array_elements)
        {
            pool.deallocate_array(array_elements);
        }
        array_elements = 0;
        max_array_size = 0;

    }